

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O1

QString * __thiscall
QXcbScreen::getName(QString *__return_storage_ptr__,QXcbScreen *this,
                   xcb_randr_monitor_info_t *monitorInfo)

{
  char *pcVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long lVar4;
  char *pcVar5;
  storage_type *psVar6;
  longlong lVar7;
  QArrayData *pQVar8;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_108;
  char16_t *pcStack_100;
  qsizetype local_f8;
  QArrayData *local_e8;
  char16_t *pcStack_e0;
  qsizetype local_d8;
  QString local_c8;
  QByteArray local_a8;
  QByteArray local_88;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QXcbBasicConnection::atomName(&local_88,*(QXcbBasicConnection **)(this + 0x10),monitorInfo->name);
  if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
    local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    pcVar5 = *(char **)(*(long *)(this + 0x10) + 0x20);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    QByteArray::QByteArray(&local_a8,pcVar5,-1);
    pcVar5 = local_a8.d.ptr;
    if (local_a8.d.ptr == (char *)0x0) {
      lVar4 = 0;
    }
    else {
      psVar6 = (storage_type *)0x1;
      if (1 < local_a8.d.size) {
        psVar6 = (storage_type *)local_a8.d.size;
      }
      lVar4 = qmemrchr(local_a8.d.ptr,0x2e,(ulong)psVar6);
    }
    if ((-(uint)(lVar4 == 0) | (int)lVar4 - (int)pcVar5) != 0xffffffff) {
      QByteArray::truncate((longlong)&local_a8);
    }
    QVar10.m_data = (storage_type *)local_a8.d.size;
    QVar10.m_size = (qsizetype)&local_e8;
    QString::fromLocal8Bit(QVar10);
    qVar3 = local_d8;
    pcVar2 = pcStack_e0;
    pQVar8 = local_e8;
    local_d8 = 0;
    local_e8 = (QArrayData *)0x0;
    pcStack_e0 = (char16_t *)0x0;
    QString::number((int)&local_108,*(int *)(*(long *)(this + 0x20) + 0x10));
    local_68.b.d.size = local_f8;
    local_68.b.d.ptr = pcStack_100;
    local_68.b.d.d = (Data *)local_108;
    local_68.a.a.d.d = (Data *)pQVar8;
    local_68.a.a.d.ptr = pcVar2;
    local_68.a.a.d.size = qVar3;
    local_68.a.b = L'.';
    local_108 = (QArrayData *)0x0;
    pcStack_100 = (char16_t *)0x0;
    local_f8 = 0;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
              (&local_c8,&local_68);
    pQVar8 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_c8.d.d;
    (__return_storage_ptr__->d).ptr = local_c8.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_c8.d.size;
    local_c8.d.d = (Data *)pQVar8;
    local_c8.d.ptr = pcVar2;
    local_c8.d.size = qVar3;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar8,2,0x10);
      }
    }
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_68);
    if (local_108 != (QArrayData *)0x0) {
      LOCK();
      (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_108,2,0x10);
      }
    }
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0016d2ec;
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0016d2ec;
    lVar7 = 1;
    pQVar8 = &(local_a8.d.d)->super_QArrayData;
  }
  else {
    pcVar5 = local_88.d.ptr;
    if (local_88.d.ptr == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar5 + 1 + (long)psVar6;
      psVar6 = psVar6 + 1;
    } while (*pcVar1 != '\0');
    QVar9.m_data = psVar6;
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar9);
    pQVar8 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_68.a.a.d.d;
    (__return_storage_ptr__->d).ptr = local_68.a.a.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_68.a.a.d.size;
    local_68.a.a.d.d = (Data *)pQVar8;
    local_68.a.a.d.ptr = pcVar2;
    local_68.a.a.d.size = qVar3;
    if (pQVar8 == (QArrayData *)0x0) goto LAB_0016d2ec;
    LOCK();
    (((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0016d2ec;
    lVar7 = 2;
  }
  QArrayData::deallocate(pQVar8,lVar7,0x10);
LAB_0016d2ec:
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXcbScreen::getName(xcb_randr_monitor_info_t *monitorInfo)
{
    QString name;
    QByteArray ba = connection()->atomName(monitorInfo->name);
    if (!ba.isEmpty()) {
        name = QString::fromLatin1(ba.constData());
    } else {
        QByteArray displayName = connection()->displayName();
        int dotPos = displayName.lastIndexOf('.');
        if (dotPos != -1)
            displayName.truncate(dotPos);
        name = QString::fromLocal8Bit(displayName) + u'.'
                + QString::number(m_virtualDesktop->number());
    }
    return name;
}